

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor_op.hpp
# Opt level: O0

void asio::detail::
     executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
     ::do_complete(void *owner,scheduler_operation *base,error_code *param_3,size_t param_4)

{
  long in_RSI;
  long in_RDI;
  fenced_block b;
  executor_function handler;
  ptr p;
  allocator<void> allocator;
  executor_op<asio::detail::executor_function,_std::allocator<void>,_asio::detail::scheduler_operation>
  *o;
  undefined4 in_stack_ffffffffffffff98;
  half_t in_stack_ffffffffffffff9c;
  ptr *in_stack_ffffffffffffffa0;
  std_fenced_block *in_stack_ffffffffffffffa8;
  executor_function local_50;
  undefined1 *local_48;
  undefined1 local_29 [33];
  long local_8;
  
  local_48 = local_29;
  local_8 = in_RDI;
  executor_function::executor_function(&local_50,(executor_function *)(in_RSI + 0x18));
  ptr::reset(in_stack_ffffffffffffffa0);
  if (local_8 != 0) {
    std_fenced_block::std_fenced_block
              ((std_fenced_block *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    asio_handler_invoke_helpers::
    invoke<asio::detail::executor_function,asio::detail::executor_function>
              ((executor_function *)in_stack_ffffffffffffffa0,
               (executor_function *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    std_fenced_block::~std_fenced_block(in_stack_ffffffffffffffa8);
  }
  executor_function::~executor_function((executor_function *)in_stack_ffffffffffffffa0);
  ptr::~ptr((ptr *)0x19789e);
  return;
}

Assistant:

static void do_complete(void* owner, Operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    executor_op* o(static_cast<executor_op*>(base));
    Alloc allocator(o->allocator_);
    ptr p = { detail::addressof(allocator), o, o };

    ASIO_HANDLER_COMPLETION((*o));

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    Handler handler(ASIO_MOVE_CAST(Handler)(o->handler_));
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN(());
      asio_handler_invoke_helpers::invoke(handler, handler);
      ASIO_HANDLER_INVOCATION_END;
    }
  }